

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_68f54f::ForcedKeyTestLarge_ForcedFrameIsKey_Test::TestBody
          (ForcedKeyTestLarge_ForcedFrameIsKey_Test *this)

{
  EncoderTest *pEVar1;
  uint uVar2;
  int limit;
  bool bVar3;
  Message *pMVar4;
  long lVar5;
  pointer *__ptr;
  SEARCH_METHODS *message;
  AssertHelper local_d8;
  AssertHelper local_d0;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  
  pEVar1 = &(this->super_ForcedKeyTestLarge).super_EncoderTest;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 0xc) {
      return;
    }
    (this->super_ForcedKeyTestLarge).frame_num_ = 0;
    uVar2 = *(uint *)((long)&DAT_00aa5660 + lVar5);
    (this->super_ForcedKeyTestLarge).forced_kf_frame_num_ = uVar2 - 1;
    (this->super_ForcedKeyTestLarge).super_EncoderTest.cfg_.g_lag_in_frames = uVar2;
    (this->super_ForcedKeyTestLarge).is_kf_placement_violated_ = false;
    std::__cxx11::string::string
              ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv",
               (allocator *)&local_d8);
    limit = 0x3c;
    if ((this->super_ForcedKeyTestLarge).fwd_kf_enabled_ == 0) {
      limit = 0x1e;
    }
    libaom_test::I420VideoSource::I420VideoSource
              ((I420VideoSource *)&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker
               ,0x160,0x120,0x1e,1,0,limit);
    std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (!bVar3) break;
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video.super_YUVVideoSource);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 != false) break;
    local_d8.data_._0_1_ = (allocator)0x0;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_fatal_failure_checker,"is_kf_placement_violated_","false",
               &(this->super_ForcedKeyTestLarge).is_kf_placement_violated_,(bool *)&local_d8);
    if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
              _vptr_TestPartResultReporterInterface == '\0') {
      testing::Message::Message((Message *)&local_d8);
      std::operator<<((ostream *)(CONCAT71(local_d8.data_._1_7_,local_d8.data_._0_1_) + 0x10),
                      "Frame #");
      pMVar4 = testing::Message::operator<<
                         ((Message *)&local_d8,&(this->super_ForcedKeyTestLarge).frame_num_);
      pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [19])" isn\'t a keyframe!");
      if ((undefined8 *)
          CONCAT71(gtest_fatal_failure_checker._9_7_,
                   gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(SEARCH_METHODS **)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
                 ,0x14e,(char *)message);
      testing::internal::AssertHelper::operator=(&local_d0,pMVar4);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)CONCAT71(local_d8.data_._1_7_,local_d8.data_._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_d8.data_._1_7_,local_d8.data_._0_1_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      goto LAB_004a2645;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
    libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
    lVar5 = lVar5 + 4;
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_d8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
             ,0x14d,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_d8);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_004a2645:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(ForcedKeyTestLarge, ForcedFrameIsKey) { ForcedFrameIsKey(); }